

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_set_var_nentry_update_test(void)

{
  char *pcVar1;
  code *pcVar2;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var3;
  long lVar4;
  short sVar5;
  size_t sVar6;
  btree_kv_ops *pbVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  undefined2 uVar12;
  long lVar13;
  undefined8 uStackY_1c0;
  undefined1 auStackY_1b8 [8];
  undefined4 in_stack_fffffffffffffe50;
  uint16_t in_stack_fffffffffffffe54;
  uint8_t in_stack_fffffffffffffe56;
  uint8_t in_stack_fffffffffffffe57;
  undefined6 in_stack_fffffffffffffe58;
  key_len_t in_stack_fffffffffffffe5e;
  void **in_stack_fffffffffffffe60;
  undefined1 local_158 [128];
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *local_d8;
  char *node_str_2;
  char *node_str_1;
  char *node_str;
  size_t offset_idx;
  void **key_ptrs;
  char *pcStack_a8;
  int n;
  char *keys [6];
  int i;
  int cmp;
  uint8_t v;
  uint8_t vsize;
  uint8_t ksize;
  btree_kv_ops *kv_ops;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  keys[3] = "123231234242423428492342";
  keys[4] = "string WITH space";
  keys[1] = "longerstring";
  keys[2] = "";
  pcStack_a8 = "string";
  keys[0] = "longstring";
  key_ptrs._4_4_ = 6;
  uStackY_1c0 = 0x102585;
  offset_idx = (size_t)auStackY_1b8;
  sVar9 = strlen("string");
  i._3_1_ = (char)sVar9 + '\x03';
  i._2_1_ = 1;
  uStackY_1c0 = 0x1025a8;
  kv_ops = (btree_kv_ops *)
           dummy_node(in_stack_fffffffffffffe57,in_stack_fffffffffffffe56,in_stack_fffffffffffffe54)
  ;
  *(idx_t *)((long)&kv_ops->get_kv + 6) = (idx_t)key_ptrs._4_4_;
  i._1_1_ = 100;
  _cmp = local_158;
  uStackY_1c0 = 0x1025d5;
  btree_str_kv_get_kb64_vb64
            ((btree_kv_ops *)
             CONCAT17(in_stack_fffffffffffffe57,
                      CONCAT16(in_stack_fffffffffffffe56,
                               CONCAT24(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))));
  node_str = (char *)0x0;
  keys[5]._4_4_ = 0;
  do {
    if (key_ptrs._4_4_ <= keys[5]._4_4_) {
      uStackY_1c0 = 0x102768;
      freevars(in_stack_fffffffffffffe60,
               CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58));
      lVar4 = -((long)key_ptrs._4_4_ * 8 + 0xfU & 0xfffffffffffffff0);
      offset_idx = (long)auStackY_1b8 + lVar4;
      node_str = (char *)0x0;
      keys[5]._4_4_ = 0;
      do {
        pbVar7 = kv_ops;
        sVar6 = offset_idx;
        if (key_ptrs._4_4_ <= keys[5]._4_4_) {
          pcVar2 = *(code **)(_cmp + 8);
          lVar13 = (long)key_ptrs._4_4_;
          *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102948;
          (*pcVar2)(pbVar7,lVar13 / 2 & 0xffff,sVar6,(long)&i + 1);
          keys[(long)(key_ptrs._4_4_ / 2) + -1] = pcStack_a8;
          pbVar7 = kv_ops;
          pcVar2 = *(code **)(_cmp + 8);
          lVar13 = offset_idx + (long)(key_ptrs._4_4_ + -1) * 8;
          *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102995;
          (*pcVar2)(pbVar7,0,lVar13,(long)&i + 1);
          pbVar7 = kv_ops;
          sVar6 = offset_idx;
          pcStack_a8 = keys[(long)(key_ptrs._4_4_ + -1) + -1];
          pcVar2 = *(code **)(_cmp + 8);
          sVar5 = (short)key_ptrs._4_4_;
          *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x1029d7;
          (*pcVar2)(pbVar7,sVar5 + -1,sVar6,(long)&i + 1);
          keys[(long)(key_ptrs._4_4_ + -1) + -1] = keys[(long)(key_ptrs._4_4_ / 2) + -1];
          node_str = (char *)0x0;
          keys[5]._4_4_ = 0;
          do {
            pbVar7 = kv_ops;
            if (key_ptrs._4_4_ <= keys[5]._4_4_) {
              *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102b15;
              free(pbVar7);
              *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102b28;
              freevars(*(void ***)(&stack0xfffffffffffffe60 + lVar4),
                       *(size_t *)(&stack0xfffffffffffffe58 + lVar4));
              *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102b2d;
              memleak_end();
              if (kv_set_var_nentry_update_test::__test_pass == 0) {
                *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102b76;
                fprintf(_stderr,"%s FAILED\n","kv_set_var_nentry_update_test");
              }
              else {
                *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102b55;
                fprintf(_stderr,"%s PASSED\n","kv_set_var_nentry_update_test");
              }
              return;
            }
            pcVar11 = node_str + 2;
            node_str = pcVar11;
            p_Var3 = kv_ops->set_kv;
            local_d8 = p_Var3 + (long)pcVar11;
            pcVar1 = keys[(long)keys[5]._4_4_ + -1];
            *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102a63;
            iVar8 = strcmp((char *)(p_Var3 + (long)pcVar11),pcVar1);
            if (iVar8 != 0) {
              *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102a90;
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                      ,0x19c);
              kv_set_var_nentry_update_test::__test_pass = 0;
              if (iVar8 != 0) {
                *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102ac1;
                __assert_fail("cmp == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                              ,0x19c,"void kv_set_var_nentry_update_test()");
              }
            }
            uVar10 = (ulong)i._2_1_;
            pcVar1 = keys[(long)keys[5]._4_4_ + -1];
            *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102adf;
            sVar9 = strlen(pcVar1);
            node_str = node_str + uVar10 + sVar9 + 1;
            keys[5]._4_4_ = keys[5]._4_4_ + 1;
          } while( true );
        }
        pcVar1 = keys[(long)keys[5]._4_4_ + -1];
        *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x1027d0;
        strlen(pcVar1);
        *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x1027f5;
        construct_key_ptr(*(char **)(&stack0xfffffffffffffe60 + lVar4),
                          *(key_len_t *)(&stack0xfffffffffffffe5e + lVar4),
                          *(void **)(&stack0xfffffffffffffe50 + lVar4));
        pbVar7 = kv_ops;
        pcVar2 = *(code **)(_cmp + 8);
        uVar12 = (undefined2)keys[5]._4_4_;
        lVar13 = offset_idx + (long)keys[5]._4_4_ * 8;
        *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102822;
        (*pcVar2)(pbVar7,uVar12,lVar13,(long)&i + 1);
        pcVar11 = node_str + 2;
        node_str = pcVar11;
        p_Var3 = kv_ops->set_kv;
        node_str_2 = (char *)(p_Var3 + (long)pcVar11);
        pcVar1 = keys[(long)keys[5]._4_4_ + -1];
        *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x102862;
        iVar8 = strcmp((char *)(p_Var3 + (long)pcVar11),pcVar1);
        if (iVar8 != 0) {
          *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x10288f;
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x184);
          kv_set_var_nentry_update_test::__test_pass = 0;
          if (iVar8 != 0) {
            *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x1028c0;
            __assert_fail("cmp == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                          ,0x184,"void kv_set_var_nentry_update_test()");
          }
        }
        uVar10 = (ulong)i._2_1_;
        pcVar1 = keys[(long)keys[5]._4_4_ + -1];
        *(undefined8 *)(auStackY_1b8 + lVar4 + -8) = 0x1028de;
        sVar9 = strlen(pcVar1);
        node_str = node_str + uVar10 + sVar9 + 1;
        keys[5]._4_4_ = keys[5]._4_4_ + 1;
      } while( true );
    }
    uStackY_1c0 = 0x10261a;
    strlen(keys[(long)keys[5]._4_4_ + -1]);
    uStackY_1c0 = 0x10263f;
    construct_key_ptr((char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5e,
                      (void *)CONCAT17(in_stack_fffffffffffffe57,
                                       CONCAT16(in_stack_fffffffffffffe56,
                                                CONCAT24(in_stack_fffffffffffffe54,
                                                         in_stack_fffffffffffffe50))));
    uStackY_1c0 = 0x10266c;
    (**(code **)(_cmp + 8))
              (kv_ops,(short)keys[5]._4_4_,offset_idx + (long)keys[5]._4_4_ * 8,(long)&i + 1);
    node_str = node_str + 2;
    node_str_1 = (char *)(kv_ops->set_kv + (long)node_str);
    uStackY_1c0 = 0x1026ac;
    iVar8 = strcmp((char *)(kv_ops->set_kv + (long)node_str),keys[(long)keys[5]._4_4_ + -1]);
    if (iVar8 != 0) {
      uStackY_1c0 = 0x1026d9;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
              ,0x173);
      kv_set_var_nentry_update_test::__test_pass = 0;
      if (iVar8 != 0) {
        uStackY_1c0 = 0x10270a;
        __assert_fail("cmp == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                      ,0x173,"void kv_set_var_nentry_update_test()");
      }
    }
    uVar10 = (ulong)i._2_1_;
    uStackY_1c0 = 0x102728;
    sVar9 = strlen(keys[(long)keys[5]._4_4_ + -1]);
    node_str = node_str + uVar10 + sVar9 + 1;
    keys[5]._4_4_ = keys[5]._4_4_ + 1;
  } while( true );
}

Assistant:

void kv_set_var_nentry_update_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    int cmp, i;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string WITH space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    size_t offset_idx = 0;

    // first pass
    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
        kv_ops->set_kv(node, i, &key_ptrs[i], (void *)&v);

        // basic node->data verification
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    freevars(key_ptrs, n);
    key_ptrs = alca(void *, n);
    offset_idx = 0;

    // second pass
    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
        kv_ops->set_kv(node, i, &key_ptrs[i], (void *)&v);

        // basic node->data verification
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    /* swap entries */

    // copy first key to middle
    kv_ops->set_kv(node, n/2, &key_ptrs[0], (void *)&v);
    keys[n/2] = keys[0];

    // copy last key to first
    kv_ops->set_kv(node, 0, &key_ptrs[n-1], (void *)&v);
    keys[0] = keys[n - 1];

    // copy middle key to last
    kv_ops->set_kv(node, n - 1, &key_ptrs[0], (void *)&v);
    keys[n - 1] = keys[n/2];

    // verify
    offset_idx = 0;
    for (i = 0; i < n; i++) {
        offset_idx += sizeof(key_len_t);
        char *node_str = (char *)((uint8_t *)node->data + offset_idx);
        cmp = strcmp(node_str, keys[i]);
        TEST_CHK(cmp == 0);
        offset_idx += vsize + strlen(keys[i]) + 1;
    }

    free(node);
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_update_test");
}